

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

Locale * __thiscall icu_63::Locale::operator=(Locale *this,Locale *other)

{
  char *pcVar1;
  
  if (this != other) {
    setToBogus(this);
    pcVar1 = other->fullName;
    if (pcVar1 == other->fullNameBuffer) {
      strcpy(this->fullNameBuffer,other->fullNameBuffer);
    }
    else if (pcVar1 == (char *)0x0) {
      this->fullName = (char *)0x0;
    }
    else {
      pcVar1 = uprv_strdup_63(pcVar1);
      this->fullName = pcVar1;
      if (pcVar1 == (char *)0x0) {
        return this;
      }
    }
    pcVar1 = other->baseName;
    if (pcVar1 == other->fullName) {
      this->baseName = this->fullName;
    }
    else if (pcVar1 != (char *)0x0) {
      pcVar1 = uprv_strdup_63(pcVar1);
      this->baseName = pcVar1;
      if (pcVar1 == (char *)0x0) {
        return this;
      }
    }
    strcpy(this->language,other->language);
    strcpy(this->script,other->script);
    strcpy(this->country,other->country);
    this->variantBegin = other->variantBegin;
    this->fIsBogus = other->fIsBogus;
  }
  return this;
}

Assistant:

Locale& Locale::operator=(const Locale& other) {
    if (this == &other) {
        return *this;
    }

    setToBogus();

    if (other.fullName == other.fullNameBuffer) {
        uprv_strcpy(fullNameBuffer, other.fullNameBuffer);
    } else if (other.fullName == nullptr) {
        fullName = nullptr;
    } else {
        fullName = uprv_strdup(other.fullName);
        if (fullName == nullptr) return *this;
    }

    if (other.baseName == other.fullName) {
        baseName = fullName;
    } else if (other.baseName != nullptr) {
        baseName = uprv_strdup(other.baseName);
        if (baseName == nullptr) return *this;
    }

    uprv_strcpy(language, other.language);
    uprv_strcpy(script, other.script);
    uprv_strcpy(country, other.country);

    variantBegin = other.variantBegin;
    fIsBogus = other.fIsBogus;

    return *this;
}